

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O3

void __thiscall
absl::strings_internal::BigUnsigned<4>::AddWithCarry(BigUnsigned<4> *this,int index,uint32_t value)

{
  uint32_t *puVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (value != 0) {
    if (index < 4) {
      do {
        puVar1 = this->words_ + index;
        bVar4 = CARRY4(*puVar1,value);
        *puVar1 = *puVar1 + value;
        index = index + (uint)bVar4;
        if (3 < index) break;
        value = (uint32_t)bVar4;
      } while (bVar4);
    }
    iVar3 = index + 1;
    if (index + 1 <= this->size_) {
      iVar3 = this->size_;
    }
    iVar2 = 4;
    if (iVar3 < 4) {
      iVar2 = iVar3;
    }
    this->size_ = iVar2;
  }
  return;
}

Assistant:

void AddWithCarry(int index, uint32_t value) {
    if (value) {
      while (index < max_words && value > 0) {
        words_[index] += value;
        // carry if we overflowed in this word:
        if (value > words_[index]) {
          value = 1;
          ++index;
        } else {
          value = 0;
        }
      }
      size_ = (std::min)(max_words, (std::max)(index + 1, size_));
    }
  }